

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall
QDomNodeListPrivate::forEachNode
          (QDomNodeListPrivate *this,function_ref<void_(QDomNodePrivate_*)> yield)

{
  QDomNodePrivate *p;
  long in_FS_OFFSET;
  QDomNodePrivate *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->node_impl != (QDomNodePrivate *)0x0) &&
      (p = findNextInOrder(this,this->node_impl), p != (QDomNodePrivate *)0x0)) &&
     (p != this->node_impl)) {
    do {
      local_38 = p;
      (*yield.super_function_ref_base<false,_void,_void,_QDomNodePrivate_*>.m_thunk_ptr)
                ((BoundEntityType)
                 yield.super_function_ref_base<false,_void,_void,_QDomNodePrivate_*>.m_bound_entity.
                 obj,&local_38);
      p = findNextInOrder(this,p);
      if (p == (QDomNodePrivate *)0x0) break;
    } while (p != this->node_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomNodeListPrivate::forEachNode(qxp::function_ref<void(QDomNodePrivate*)> yield) const
{
    if (!node_impl)
        return;

    QDomNodePrivate *current = findNextInOrder(node_impl);
    while (current && current != node_impl) {
        yield(current);
        current = findNextInOrder(current);
    }
}